

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O0

int log_map_destroy(log_map map)

{
  long *in_RDI;
  size_t iterator;
  ulong local_18;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = 1;
  }
  else {
    if (*in_RDI != 0) {
      free((void *)*in_RDI);
    }
    if (in_RDI[3] != 0) {
      for (local_18 = 0; local_18 < (ulong)in_RDI[4]; local_18 = local_18 + 1) {
        if (*(long *)(in_RDI[3] + local_18 * 8) != 0) {
          free(*(void **)(in_RDI[3] + local_18 * 8));
        }
      }
      free((void *)in_RDI[3]);
    }
    free(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int log_map_destroy(log_map map)
{
	if (map == NULL)
	{
		return 1;
	}

	if (map->table.data != NULL)
	{
		free(map->table.data);
	}

	if (map->block.data != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < map->block.count; ++iterator)
		{
			if (map->block.data[iterator] != NULL)
			{
				free(map->block.data[iterator]);
			}
		}

		free(map->block.data);
	}

	free(map);

	return 0;
}